

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O3

void __thiscall Pool::~Pool(Pool *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_Pool::WeightedEdgeCmp,_std::allocator<Edge_*>_>::
  ~_Rb_tree(&(this->delayed_)._M_t);
  pcVar1 = (this->name_)._M_dataplus._M_p;
  paVar2 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Pool(const std::string& name, int depth)
    : name_(name), current_use_(0), depth_(depth), delayed_() {}